

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonEachCursorReset(JsonEachCursor *p)

{
  void *in_RDI;
  
  jsonParseReset((JsonParse *)0x2a5485);
  jsonStringReset((JsonString *)0x2a5492);
  sqlite3DbFree((sqlite3 *)p,in_RDI);
  *(undefined4 *)((long)in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined8 *)((long)in_RDI + 0x28) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  *(undefined4 *)((long)in_RDI + 0x20) = 0;
  *(undefined4 *)((long)in_RDI + 0x10) = 0;
  *(undefined1 *)((long)in_RDI + 0x18) = 0;
  return;
}

Assistant:

static void jsonEachCursorReset(JsonEachCursor *p){
  jsonParseReset(&p->sParse);
  jsonStringReset(&p->path);
  sqlite3DbFree(p->db, p->aParent);
  p->iRowid = 0;
  p->i = 0;
  p->aParent = 0;
  p->nParent = 0;
  p->nParentAlloc = 0;
  p->iEnd = 0;
  p->eType = 0;
}